

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

void __thiscall
RuntimeObjectSystem::CompileAllInProject
          (RuntimeObjectSystem *this,bool bForceRecompile,unsigned_short projectId_)

{
  pointer pPVar1;
  bool bVar2;
  ProjectSettings *pPVar3;
  ulong uVar4;
  long lVar5;
  AUDynArray<IObjectConstructor_*> constructors;
  string local_50;
  
  pPVar3 = GetProject(this,projectId_);
  std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::clear
            (&pPVar3->m_BuildFileList);
  if (this->m_bAutoCompile == false) {
    AUDynArray<IObjectConstructor_*>::AUDynArray(&constructors,0);
    (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[4])
              (this->m_pObjectFactorySystem,&constructors);
    SetupRuntimeFileTracking(this,&constructors.super_IAUDynArray<IObjectConstructor_*>);
    AUDynArray<IObjectConstructor_*>::~AUDynArray(&constructors);
  }
  lVar5 = 0;
  for (uVar4 = 0;
      pPVar1 = (this->m_Projects).
               super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)pPVar1[projectId_].m_RuntimeFileList.
                             super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      *(long *)&pPVar1[projectId_].m_RuntimeFileList.
                                super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                ._M_impl.super__Vector_impl_data) / 0x28); uVar4 = uVar4 + 1) {
    FileSystemUtils::Path::Path
              ((Path *)&constructors,
               (Path *)((long)&((pPVar3->m_RuntimeFileList).
                                super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_Path + lVar5));
    FileSystemUtils::Path::Extension_abi_cxx11_(&local_50,(Path *)&constructors);
    bVar2 = std::operator!=(&local_50,".h");
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::push_back
                (&pPVar3->m_BuildFileList,(value_type *)&constructors);
    }
    FileSystemUtils::Path::~Path((Path *)&constructors);
    lVar5 = lVar5 + 0x28;
  }
  StartRecompile(this);
  return;
}

Assistant:

void RuntimeObjectSystem::CompileAllInProject( bool bForceRecompile, unsigned short projectId_ )
{
    (void)bForceRecompile;
    ProjectSettings& project = GetProject( projectId_ );
    // since this is a compile all we can clear any pending compiles
    project.m_BuildFileList.clear( );

	// ensure we have an up to date list of files to commpile if autocompile is off
	if( !m_bAutoCompile )
	{
		AUDynArray<IObjectConstructor*> constructors;
		m_pObjectFactorySystem->GetAll(constructors);
		SetupRuntimeFileTracking(constructors);
	}

	// add all files except headers
    for( size_t i = 0; i < m_Projects[ projectId_ ].m_RuntimeFileList.size( ); ++i )
	{
        BuildTool::FileToBuild fileToBuild( project.m_RuntimeFileList[ i ], true ); //force re-compile on compile all
		if( fileToBuild.filePath.Extension() != ".h") //TODO: change to check for .cpp and .c as could have .inc files etc.?
		{
            project.m_BuildFileList.push_back( fileToBuild );
		}
	}

	StartRecompile();
}